

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O2

void update_node_encoding(adh_node_t *node)

{
  adh_node *paVar1;
  long lVar2;
  adh_node_t *paVar3;
  
  if (node != (adh_node_t *)0x0) {
    update_node_encoding(node->left);
    update_node_encoding(node->right);
    lVar2 = 0;
    paVar3 = node;
    while (paVar1 = paVar3->parent, paVar1 != (adh_node *)0x0) {
      if (lVar2 == 0x100) {
        (node->bit_array).length = 0x100;
        log_error("update_node_encoding","bit_array->length == MAX_CODE_BITS");
        exit(1);
      }
      (node->bit_array).buffer[lVar2] = paVar1->right == paVar3 | 0x30;
      lVar2 = lVar2 + 1;
      paVar3 = paVar1;
    }
    (node->bit_array).length = (uint16_t)lVar2;
  }
  return;
}

Assistant:

void update_node_encoding(adh_node_t *node) {
    if(node != NULL) {
        update_node_encoding(node->left);
        update_node_encoding(node->right);

        bit_array_t* bit_array = &(node->bit_array);
        bit_array->length = 0;

        adh_node_t * parent = node->parent;
        while(parent != NULL) {
            if(bit_array->length == MAX_CODE_BITS) {
                log_error("update_node_encoding", "bit_array->length == MAX_CODE_BITS");

                //TODO: exit properly, need to release resources
                exit(1);
            }

            // 0 = left node, 1 = right node
            bit_array->buffer[bit_array->length] = (parent->right == node) ? BIT_1 : BIT_0;
            bit_array->length++;

            node = parent;
            parent = node->parent;
        }

#ifdef _DEBUG
        log_trace("  update_node_encoding", "%s bin=%s\n",
                fmt_node(node),
                fmt_bit_array(bit_array));
#endif

    }
}